

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O3

hwaddr ppc_hash32_bat_lookup(PowerPCCPU_conflict3 *cpu,target_ulong ea,int rwx,int *prot)

{
  powerpc_mmu_t pVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar6 = (ulong)(cpu->env).nb_BATs;
  if (uVar6 != 0) {
    pVar1 = (cpu->env).mmu_model;
    uVar9 = 0;
    do {
      uVar2 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2][uVar9];
      uVar3 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2 + 1][uVar9];
      uVar5 = (uint)uVar2;
      uVar8 = (uint)uVar3;
      if (pVar1 == POWERPC_MMU_601) {
        if ((uVar3 & 0x40) != 0) {
          uVar7 = (uVar8 & 0x3f) << 0x11;
          goto LAB_00bea143;
        }
      }
      else {
        uVar4 = (cpu->env).msr;
        if ((((uVar2 & 1) == 0 & (byte)(((uint)uVar4 & 0x4000) >> 0xe)) == 0) &&
           ((uVar4 & 0x4000) != 0 || (uVar2 & 2) != 0)) {
          uVar7 = (uVar5 & 0x1ffc) << 0xf;
LAB_00bea143:
          if (((uint)ea & (uVar7 ^ 0xfffe0000)) == (uVar5 & 0xfffe0000)) {
            if (pVar1 == POWERPC_MMU_601) {
              if (((uint)(((cpu->env).msr & 0x4000) == 0) * 4 + 4 & uVar5) == 0) {
                uVar5 = (uint)((~uVar5 & 3) != 0) * 2 + 5;
              }
              else {
                uVar5 = *(uint *)(&DAT_00db2c98 + (ulong)(uVar5 & 3) * 4);
              }
            }
            else {
              uVar5 = (uint)((uVar8 & 3) == 2) * 2 + 5;
              if ((uVar3 & 3) == 0) {
                uVar5 = uVar8 & 3;
              }
            }
            *prot = uVar5;
            return (ulong)((uVar7 ^ 0xfffe0000) & uVar8) | ((ulong)uVar7 | 0xffffffff0001f000) & ea;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  return 0xffffffffffffffff;
}

Assistant:

static hwaddr ppc_hash32_bat_lookup(PowerPCCPU *cpu, target_ulong ea, int rwx,
                                    int *prot)
{
    CPUPPCState *env = &cpu->env;
    target_ulong *BATlt, *BATut;
    int i;

    LOG_BATS("%s: %cBAT v " TARGET_FMT_lx "\n", __func__,
             rwx == 2 ? 'I' : 'D', ea);
    if (rwx == 2) {
        BATlt = env->IBAT[1];
        BATut = env->IBAT[0];
    } else {
        BATlt = env->DBAT[1];
        BATut = env->DBAT[0];
    }
    for (i = 0; i < env->nb_BATs; i++) {
        target_ulong batu = BATut[i];
        target_ulong batl = BATlt[i];
        target_ulong mask;

        if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
            mask = hash32_bat_601_size(cpu, batu, batl);
        } else {
            mask = hash32_bat_size(cpu, batu, batl);
        }
        LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                 " BATl " TARGET_FMT_lx "\n", __func__,
                 type == ACCESS_CODE ? 'I' : 'D', i, ea, batu, batl);

        if (mask && ((ea & mask) == (batu & BATU32_BEPI))) {
            hwaddr raddr = (batl & mask) | (ea & ~mask);

            if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
                *prot = hash32_bat_601_prot(cpu, batu, batl);
            } else {
                *prot = hash32_bat_prot(cpu, batu, batl);
            }

            return raddr & TARGET_PAGE_MASK;
        }
    }

    /* No hit */
#if defined(DEBUG_BATS)
    if (qemu_log_enabled()) {
        LOG_BATS("no BAT match for " TARGET_FMT_lx ":\n", ea);
        for (i = 0; i < 4; i++) {
            BATu = &BATut[i];
            BATl = &BATlt[i];
            BEPIu = *BATu & BATU32_BEPIU;
            BEPIl = *BATu & BATU32_BEPIL;
            bl = (*BATu & 0x00001FFC) << 15;
            LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                     " BATl " TARGET_FMT_lx "\n\t" TARGET_FMT_lx " "
                     TARGET_FMT_lx " " TARGET_FMT_lx "\n",
                     __func__, type == ACCESS_CODE ? 'I' : 'D', i, ea,
                     *BATu, *BATl, BEPIu, BEPIl, bl);
        }
    }
#endif

    return -1;
}